

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slapack_lite.c
# Opt level: O0

integer ieeeck_(integer *ispec,real *zero,real *one)

{
  integer ret_val;
  real *one_local;
  real *zero_local;
  integer *ispec_local;
  
  ieeeck_::posinf = *one / *zero;
  if (*one < ieeeck_::posinf) {
    ieeeck_::neginf = -*one / *zero;
    if (ieeeck_::neginf < *zero) {
      ieeeck_::negzro = *one / (ieeeck_::neginf + *one);
      if ((ieeeck_::negzro != *zero) || (NAN(ieeeck_::negzro) || NAN(*zero))) {
        ispec_local._4_4_ = 0;
      }
      else {
        ieeeck_::neginf = *one / ieeeck_::negzro;
        if (ieeeck_::neginf < *zero) {
          ieeeck_::newzro = ieeeck_::negzro + *zero;
          if ((ieeeck_::newzro != *zero) || (NAN(ieeeck_::newzro) || NAN(*zero))) {
            ispec_local._4_4_ = 0;
          }
          else {
            ieeeck_::posinf = *one / ieeeck_::newzro;
            if (*one < ieeeck_::posinf) {
              ieeeck_::neginf = ieeeck_::posinf * ieeeck_::neginf;
              if (ieeeck_::neginf < *zero) {
                ieeeck_::posinf = ieeeck_::posinf * ieeeck_::posinf;
                if (*one < ieeeck_::posinf) {
                  if (*ispec == 0) {
                    ispec_local._4_4_ = 1;
                  }
                  else {
                    ieeeck_::nan1 = ieeeck_::posinf + ieeeck_::neginf;
                    ieeeck_::nan2 = ieeeck_::posinf / ieeeck_::neginf;
                    ieeeck_::nan3 = ieeeck_::posinf / ieeeck_::posinf;
                    ieeeck_::nan4 = ieeeck_::posinf * *zero;
                    ieeeck_::nan5 = ieeeck_::neginf * ieeeck_::negzro;
                    ieeeck_::nan6 = ieeeck_::nan5 * 0.0;
                    if (NAN(ieeeck_::nan1)) {
                      if (NAN(ieeeck_::nan2)) {
                        if (NAN(ieeeck_::nan3)) {
                          if (NAN(ieeeck_::nan4)) {
                            if (NAN(ieeeck_::nan5)) {
                              if (NAN(ieeeck_::nan6)) {
                                ispec_local._4_4_ = 1;
                              }
                              else {
                                ispec_local._4_4_ = 0;
                              }
                            }
                            else {
                              ispec_local._4_4_ = 0;
                            }
                          }
                          else {
                            ispec_local._4_4_ = 0;
                          }
                        }
                        else {
                          ispec_local._4_4_ = 0;
                        }
                      }
                      else {
                        ispec_local._4_4_ = 0;
                      }
                    }
                    else {
                      ispec_local._4_4_ = 0;
                    }
                  }
                }
                else {
                  ispec_local._4_4_ = 0;
                }
              }
              else {
                ispec_local._4_4_ = 0;
              }
            }
            else {
              ispec_local._4_4_ = 0;
            }
          }
        }
        else {
          ispec_local._4_4_ = 0;
        }
      }
    }
    else {
      ispec_local._4_4_ = 0;
    }
  }
  else {
    ispec_local._4_4_ = 0;
  }
  return ispec_local._4_4_;
}

Assistant:

integer ieeeck_(integer *ispec, real *zero, real *one)
{
    /* System generated locals */
    integer ret_val;

    /* Local variables */
    static real nan1, nan2, nan3, nan4, nan5, nan6, neginf, posinf, negzro,
	    newzro;


/*
    -- LAPACK auxiliary routine (version 3.0) --
       Univ. of Tennessee, Univ. of California Berkeley, NAG Ltd.,
       Courant Institute, Argonne National Lab, and Rice University
       June 30, 1998


    Purpose
    =======

    IEEECK is called from the ILAENV to verify that Infinity and
    possibly NaN arithmetic is safe (i.e. will not trap).

    Arguments
    =========

    ISPEC   (input) INTEGER
            Specifies whether to test just for inifinity arithmetic
            or whether to test for infinity and NaN arithmetic.
            = 0: Verify infinity arithmetic only.
            = 1: Verify infinity and NaN arithmetic.

    ZERO    (input) REAL
            Must contain the value 0.0
            This is passed to prevent the compiler from optimizing
            away this code.

    ONE     (input) REAL
            Must contain the value 1.0
            This is passed to prevent the compiler from optimizing
            away this code.

    RETURN VALUE:  INTEGER
            = 0:  Arithmetic failed to produce the correct answers
            = 1:  Arithmetic produced the correct answers
*/

    ret_val = 1;

    posinf = *one / *zero;
    if (posinf <= *one) {
	ret_val = 0;
	return ret_val;
    }

    neginf = -(*one) / *zero;
    if (neginf >= *zero) {
	ret_val = 0;
	return ret_val;
    }

    negzro = *one / (neginf + *one);
    if (negzro != *zero) {
	ret_val = 0;
	return ret_val;
    }

    neginf = *one / negzro;
    if (neginf >= *zero) {
	ret_val = 0;
	return ret_val;
    }

    newzro = negzro + *zero;
    if (newzro != *zero) {
	ret_val = 0;
	return ret_val;
    }

    posinf = *one / newzro;
    if (posinf <= *one) {
	ret_val = 0;
	return ret_val;
    }

    neginf *= posinf;
    if (neginf >= *zero) {
	ret_val = 0;
	return ret_val;
    }

    posinf *= posinf;
    if (posinf <= *one) {
	ret_val = 0;
	return ret_val;
    }


/*     Return if we were only asked to check infinity arithmetic */

    if (*ispec == 0) {
	return ret_val;
    }

    nan1 = posinf + neginf;

    nan2 = posinf / neginf;

    nan3 = posinf / posinf;

    nan4 = posinf * *zero;

    nan5 = neginf * negzro;

    nan6 = nan5 * 0.f;

    if (nan1 == nan1) {
	ret_val = 0;
	return ret_val;
    }

    if (nan2 == nan2) {
	ret_val = 0;
	return ret_val;
    }

    if (nan3 == nan3) {
	ret_val = 0;
	return ret_val;
    }

    if (nan4 == nan4) {
	ret_val = 0;
	return ret_val;
    }

    if (nan5 == nan5) {
	ret_val = 0;
	return ret_val;
    }

    if (nan6 == nan6) {
	ret_val = 0;
	return ret_val;
    }

    return ret_val;
}